

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

char fmt::v7::detail::thousands_sep_impl<char>(locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  locale_ref loc_local;
  
  locale_ref::get<std::locale>(&loc_local);
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&loc_local);
  cVar1 = (**(code **)(*(long *)pnVar2 + 0x18))(pnVar2);
  std::locale::~locale((locale *)&loc_local);
  return cVar1;
}

Assistant:

FMT_FUNC Char thousands_sep_impl(locale_ref loc) {
  return std::use_facet<std::numpunct<Char>>(loc.get<std::locale>())
      .thousands_sep();
}